

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O3

LongReadsMapper * __thiscall
LongReadsMapper::operator=(LongReadsMapper *this,LongReadsMapper *other)

{
  runtime_error *this_00;
  
  if (other != this) {
    if ((this->sg != other->sg) && (this->datastore != other->datastore)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "Can only LongReadsMappers from the same SequenceDistanceGraph and LongReadsDatastore"
                );
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->sat_kmer_index = other->sat_kmer_index;
    this->k = other->k;
    std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::operator=
              (&this->mappings,&other->mappings);
    update_indexes(this);
  }
  return this;
}

Assistant:

LongReadsMapper& LongReadsMapper::operator=(const LongReadsMapper &other) {
    if (&other == this) {
        return *this;
    }
    if (&sg != &other.sg and &datastore != &other.datastore) { throw std::runtime_error("Can only LongReadsMappers from the same SequenceDistanceGraph and LongReadsDatastore"); }
    sat_kmer_index = other.sat_kmer_index;
    k = other.k;
    mappings = other.mappings;
    update_indexes();
    return *this;
}